

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartsWithTestTest.cpp
# Opt level: O1

void __thiscall StartsWithTestTest::StartsWithTestTest(StartsWithTestTest *this)

{
  TestText *this_00;
  NamedTest *this_01;
  pointer *__ptr;
  _Head_base<0UL,_TestText_*,_false> local_68;
  _Head_base<0UL,_oout::StartsWithTest_*,_false> local_60;
  string local_58;
  shared_ptr<oout::EqualTest> local_38;
  shared_ptr<const_oout::NamedTest> local_28;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__StartsWithTestTest_00198ba0;
  std::make_unique<oout::StartsWithTest,char_const(&)[7],char_const(&)[4]>
            ((char (*) [7])&local_60,(char (*) [4])"abcdef");
  this_00 = (TestText *)operator_new(0x18);
  std::__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::StartsWithTest,std::default_delete<oout::StartsWithTest>,void>
            ((__shared_ptr<oout::Test_const,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (unique_ptr<oout::StartsWithTest,_std::default_delete<oout::StartsWithTest>_> *)
             &local_60);
  TestText::TestText(this_00,(shared_ptr<const_oout::Test> *)&local_58);
  local_68._M_head_impl = this_00;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
  }
  local_38.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::EqualTest,std::allocator<oout::EqualTest>,std::unique_ptr<TestText,std::default_delete<TestText>>,char_const(&)[8]>
            (&local_38.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (EqualTest **)&local_38,(allocator<oout::EqualTest> *)&local_58,
             (unique_ptr<TestText,_std::default_delete<TestText>_> *)&local_68,
             (char (*) [8])0x17da77);
  local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedTest_const,std::allocator<oout::NamedTest>,char_const(&)[18],std::shared_ptr<oout::EqualTest>>
            (&local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(NamedTest **)&local_28,(allocator<oout::NamedTest> *)&local_58,
             (char (*) [18])"Realy starts with",&local_38);
  this_01 = (NamedTest *)operator_new(0x38);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"StartsWithTestTest","");
  oout::NamedTest::NamedTest(this_01,&local_58,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (this->tests)._M_t.super___uniq_ptr_impl<const_oout::Test,_std::default_delete<const_oout::Test>_>
  ._M_t.super__Tuple_impl<0UL,_const_oout::Test_*,_std::default_delete<const_oout::Test>_>.
  super__Head_base<0UL,_const_oout::Test_*,_false>._M_head_impl = (Test *)this_01;
  if (local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<const_oout::NamedTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<oout::EqualTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68._M_head_impl != (TestText *)0x0) {
    std::default_delete<TestText>::operator()
              ((default_delete<TestText> *)&local_68,local_68._M_head_impl);
  }
  local_68._M_head_impl = (TestText *)0x0;
  if (local_60._M_head_impl != (StartsWithTest *)0x0) {
    std::default_delete<oout::StartsWithTest>::operator()
              ((default_delete<oout::StartsWithTest> *)&local_60,local_60._M_head_impl);
  }
  return;
}

Assistant:

StartsWithTestTest::StartsWithTestTest()
	: tests(
		make_unique<NamedTest>(
			"StartsWithTestTest",
			make_shared<const NamedTest>(
				"Realy starts with",
				make_shared<EqualTest>(
					make_unique<TestText>(
						make_unique<StartsWithTest>(
							"abcdef",
							"abc"
						)
					),
					"success"
				)
			)
		)
	)
{
}